

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_encoder.cc
# Opt level: O3

bool __thiscall
draco::MetadataEncoder::EncodeMetadata
          (MetadataEncoder *this,EncoderBuffer *out_buffer,Metadata *metadata)

{
  uint uVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  ulong uVar8;
  
  uVar1 = (uint)(metadata->entries_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var5 = (_Rb_tree_node_base *)(ulong)uVar1;
  EncodeVarint<unsigned_int>(uVar1,out_buffer);
  p_Var3 = (metadata->entries_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var6 = p_Var3,
        (_Rb_tree_header *)p_Var6 != &(metadata->entries_)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = EncodeString((MetadataEncoder *)p_Var5,out_buffer,(string *)(p_Var6 + 1));
    if (!bVar2) {
      return false;
    }
    uVar8 = (long)p_Var6[2]._M_parent - *(long *)(p_Var6 + 2);
    EncodeVarint<unsigned_int>((uint)uVar8,out_buffer);
    if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)out_buffer,
                 (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,*(long *)(p_Var6 + 2),
                 (uVar8 & 0xffffffff) + *(long *)(p_Var6 + 2));
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    p_Var5 = p_Var6;
  }
  uVar1 = (uint)(metadata->sub_metadatas_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var5 = (_Rb_tree_node_base *)(ulong)uVar1;
  EncodeVarint<unsigned_int>(uVar1,out_buffer);
  p_Var7 = (metadata->sub_metadatas_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(metadata->sub_metadatas_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 == p_Var4) {
    bVar2 = true;
  }
  else {
    do {
      bVar2 = EncodeString((MetadataEncoder *)p_Var5,out_buffer,(string *)(p_Var7 + 1));
      if (!bVar2) {
        return bVar2;
      }
      EncodeMetadata(this,out_buffer,*(Metadata **)(p_Var7 + 2));
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      p_Var5 = p_Var7;
      p_Var7 = p_Var3;
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return bVar2;
}

Assistant:

bool MetadataEncoder::EncodeMetadata(EncoderBuffer *out_buffer,
                                     const Metadata *metadata) {
  const std::map<std::string, EntryValue> &entries = metadata->entries();
  // Encode number of entries.
  EncodeVarint(static_cast<uint32_t>(metadata->num_entries()), out_buffer);
  // Encode all entries.
  for (const auto &entry : entries) {
    if (!EncodeString(out_buffer, entry.first)) {
      return false;
    }
    const std::vector<uint8_t> &entry_value = entry.second.data();
    const uint32_t data_size = static_cast<uint32_t>(entry_value.size());
    EncodeVarint(data_size, out_buffer);
    out_buffer->Encode(entry_value.data(), data_size);
  }
  const std::map<std::string, std::unique_ptr<Metadata>> &sub_metadatas =
      metadata->sub_metadatas();
  // Encode number of sub-metadata
  EncodeVarint(static_cast<uint32_t>(sub_metadatas.size()), out_buffer);
  // Encode each sub-metadata
  for (auto &&sub_metadata_entry : sub_metadatas) {
    if (!EncodeString(out_buffer, sub_metadata_entry.first)) {
      return false;
    }
    EncodeMetadata(out_buffer, sub_metadata_entry.second.get());
  }

  return true;
}